

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

bool is_utf8(char *string)

{
  byte *local_20;
  uchar *bytes;
  char *string_local;
  
  local_20 = (byte *)string;
  if (string == (char *)0x0) {
    string_local._7_1_ = false;
  }
  else {
    while (*local_20 != 0) {
      if ((((*local_20 == 9) || (*local_20 == 10)) || (*local_20 == 0xd)) ||
         ((0x1f < *local_20 && (*local_20 < 0x7f)))) {
        local_20 = local_20 + 1;
      }
      else if (((*local_20 < 0xc2) || (0xdf < *local_20)) ||
              ((local_20[1] < 0x80 || (0xbf < local_20[1])))) {
        if ((((((*local_20 == 0xe0) && (0x9f < local_20[1])) && (local_20[1] < 0xc0)) &&
             ((0x7f < local_20[2] && (local_20[2] < 0xc0)))) ||
            ((((0xe0 < *local_20 && (*local_20 < 0xed)) ||
              ((*local_20 == 0xee || (*local_20 == 0xef)))) &&
             ((0x7f < local_20[1] &&
              (((local_20[1] < 0xc0 && (0x7f < local_20[2])) && (local_20[2] < 0xc0)))))))) ||
           ((((*local_20 == 0xed && (0x7f < local_20[1])) && (local_20[1] < 0xa0)) &&
            ((0x7f < local_20[2] && (local_20[2] < 0xc0)))))) {
          local_20 = local_20 + 3;
        }
        else {
          if (((((((*local_20 != 0xf0) || (local_20[1] < 0x90)) || (0xbf < local_20[1])) ||
                ((local_20[2] < 0x80 || (0xbf < local_20[2])))) || (local_20[3] < 0x80)) ||
              (0xbf < local_20[3])) &&
             ((((*local_20 < 0xf1 || (0xf3 < *local_20)) ||
               (((local_20[1] < 0x80 ||
                 (((0xbf < local_20[1] || (local_20[2] < 0x80)) || (0xbf < local_20[2])))) ||
                ((local_20[3] < 0x80 || (0xbf < local_20[3])))))) &&
              ((*local_20 != 0xf4 ||
               (((local_20[1] < 0x80 || (0x8f < local_20[1])) ||
                ((local_20[2] < 0x80 ||
                 (((0xbf < local_20[2] || (local_20[3] < 0x80)) || (0xbf < local_20[3])))))))))))) {
            return false;
          }
          local_20 = local_20 + 4;
        }
      }
      else {
        local_20 = local_20 + 2;
      }
    }
    string_local._7_1_ = true;
  }
  return string_local._7_1_;
}

Assistant:

bool is_utf8(const char * string)
{
	if (!string)
		return 0;

	const unsigned char * bytes = (const unsigned char *)string;
	while (*bytes)
	{
		if ((// ASCII
			// use bytes[0] <= 0x7F to allow ASCII control characters
			bytes[0] == 0x09 ||
			bytes[0] == 0x0A ||
			bytes[0] == 0x0D ||
			(0x20 <= bytes[0] && bytes[0] <= 0x7E)
			)
			) {
			bytes += 1;
			continue;
		}

		if ((// non-overlong 2-byte
			(0xC2 <= bytes[0] && bytes[0] <= 0xDF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF)
			)
			) {
			bytes += 2;
			continue;
		}

		if ((// excluding overlongs
			bytes[0] == 0xE0 &&
			(0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// straight 3-byte
			((0xE1 <= bytes[0] && bytes[0] <= 0xEC) ||
			bytes[0] == 0xEE ||
			bytes[0] == 0xEF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// excluding surrogates
			bytes[0] == 0xED &&
			(0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			)
			) {
			bytes += 3;
			continue;
		}

		if ((// planes 1-3
			bytes[0] == 0xF0 &&
			(0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// planes 4-15
			(0xF1 <= bytes[0] && bytes[0] <= 0xF3) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// plane 16
			bytes[0] == 0xF4 &&
			(0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			)
			) {
			bytes += 4;
			continue;
		}
		return 0;
	}
	return 1;
}